

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

_Bool Curl_rtsp_connisdead(connectdata *check)

{
  uint uVar1;
  curl_socket_t cVar2;
  _Bool local_15;
  curl_socket_t connectinfo;
  _Bool ret_val;
  connectdata *pcStack_10;
  int sval;
  connectdata *check_local;
  
  local_15 = true;
  pcStack_10 = check;
  uVar1 = Curl_socket_check(check->sock[0],-1,-1,0);
  if (uVar1 == 0) {
    local_15 = false;
  }
  else if ((uVar1 & 4) == 0) {
    if (((uVar1 & 1) != 0) && (pcStack_10->data != (SessionHandle *)0x0)) {
      cVar2 = Curl_getconnectinfo(pcStack_10->data,&stack0xfffffffffffffff0);
      local_15 = cVar2 == -1;
    }
  }
  else {
    local_15 = true;
  }
  return local_15;
}

Assistant:

bool Curl_rtsp_connisdead(struct connectdata *check)
{
  int sval;
  bool ret_val = TRUE;

  sval = Curl_socket_ready(check->sock[FIRSTSOCKET], CURL_SOCKET_BAD, 0);
  if(sval == 0) {
    /* timeout */
    ret_val = FALSE;
  }
  else if(sval & CURL_CSELECT_ERR) {
    /* socket is in an error state */
    ret_val = TRUE;
  }
  else if((sval & CURL_CSELECT_IN) && check->data) {
    /* readable with no error. could be closed or could be alive but we can
       only check if we have a proper SessionHandle for the connection */
    curl_socket_t connectinfo = Curl_getconnectinfo(check->data, &check);
    if(connectinfo != CURL_SOCKET_BAD)
      ret_val = FALSE;
  }

  return ret_val;
}